

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a,peer_class_info *a_1)

{
  int iVar1;
  element_type *peVar2;
  io_context *piVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *in_R8;
  bool bVar5;
  undefined1 local_90 [32];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_70;
  undefined8 local_68;
  long *local_60 [2];
  long local_50 [4];
  io_context *local_30;
  undefined4 local_24;
  
  this_00 = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  if ((!bVar5) &&
     (peVar2 = (this->m_impl).
               super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar2 != (element_type *)0x0)) {
    piVar3 = peVar2->m_io_context;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_70.m_val = *(uint *)a_1;
    local_68 = *in_R8;
    local_90._0_8_ = peVar2;
    local_90._8_8_ = this_00;
    local_90._16_8_ = f;
    local_90._24_8_ = a;
    local_60[0] = local_50;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_60,in_R8[1],in_R8[2] + in_R8[1]);
    local_50[2] = in_R8[5];
    local_50[3] = in_R8[6];
    local_24 = 0;
    local_30 = piVar3;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&)const::_lambda()_1_>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_30,(type_conflict17 *)local_90
              );
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  local_90._0_4_ = 0x73;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_90);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}